

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse-matrix.hpp
# Opt level: O3

void __thiscall
baryonyx::sparse_matrix<int>::sparse_matrix<baryonyx::itm::merged_constraint>
          (sparse_matrix<int> *this,
          vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
          *csts,int rows,int cols)

{
  uint *puVar1;
  uint uVar2;
  pointer pmVar3;
  function_element *pfVar4;
  bool bVar5;
  byte bVar6;
  long lVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  uint uVar10;
  _Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_> _Var11;
  _Head_base<0UL,_int_*,_false> _Var12;
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false> _Var13;
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false> _Var14;
  void *__s;
  pointer *ppfVar15;
  void *__s_00;
  ulong uVar16;
  undefined8 extraout_RAX;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  int iVar20;
  long in_R8;
  col_value cVar21;
  row_value *__tmp;
  uint __tmp_1;
  size_type sVar22;
  function_element *__args_2;
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  uint __tmp_3;
  vector<access,_std::allocator<access>_> accessors;
  undefined1 local_88 [16];
  pointer local_78;
  _Temporary_buffer<__gnu_cxx::__normal_iterator<access_*,_std::vector<access,_std::allocator<access>_>_>,_access>
  local_68;
  ulong local_50;
  ulong local_48;
  size_t local_40;
  ulong local_38;
  undefined1 auVar25 [32];
  undefined1 auVar30 [64];
  
  uVar18 = (ulong)(rows + 1U) * 4;
  _Var11.super__Head_base<0UL,_int_*,_false>._M_head_impl =
       (_Head_base<0UL,_int_*,_false>)operator_new__(uVar18);
  memset((void *)_Var11.super__Head_base<0UL,_int_*,_false>._M_head_impl,0,uVar18);
  (this->m_rows_access).m_buffer._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false> =
       _Var11.super__Head_base<0UL,_int_*,_false>._M_head_impl;
  (this->m_rows_access).m_length = rows + 1U;
  uVar18 = (ulong)(cols + 1U) * 4;
  local_48 = (ulong)(uint)cols;
  _Var12._M_head_impl = (int *)operator_new__(uVar18);
  memset(_Var12._M_head_impl,0,uVar18);
  local_50 = 0;
  (this->m_cols_access).m_buffer._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = _Var12._M_head_impl;
  (this->m_cols_access).m_length = cols + 1U;
  (this->m_rows_values).m_buffer._M_t.
  super___uniq_ptr_impl<baryonyx::sparse_matrix<int>::row_value,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
  .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl =
       (row_value *)0x0;
  (this->m_rows_values).m_length = 0;
  (this->m_cols_values).m_buffer._M_t.
  super___uniq_ptr_impl<baryonyx::sparse_matrix<int>::col_value,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
  .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>._M_head_impl =
       (col_value *)0x0;
  (this->m_cols_values).m_length = 0;
  uVar18 = (ulong)(uint)rows;
  if (rows != 0) {
    auVar26 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar27 = vpbroadcastq_avx512f(ZEXT816(0x28));
    auVar28 = vpbroadcastq_avx512f(ZEXT816(8));
    uVar17 = uVar18 + 7 & 0xfffffffffffffff8;
    auVar29 = vpbroadcastq_avx512f();
    pmVar3 = (csts->
             super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
             )._M_impl.super__Vector_impl_data._M_start;
    auVar30 = ZEXT1664((undefined1  [16])0x0);
    do {
      auVar33 = auVar30;
      vpmullq_avx512dq(auVar26,auVar27);
      uVar16 = vpcmpuq_avx512f(auVar26,auVar29,2);
      auVar26 = vpaddq_avx512f(auVar26,auVar28);
      uVar17 = uVar17 - 8;
      auVar30 = vpgatherqq_avx512f(*(undefined8 *)
                                    ((long)&(pmVar3->elements).
                                            super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                            ._M_impl + in_R8 + 8));
      bVar6 = (byte)uVar16;
      auVar31._8_8_ = (ulong)((byte)(uVar16 >> 1) & 1) * auVar30._8_8_;
      auVar31._0_8_ = (ulong)(bVar6 & 1) * auVar30._0_8_;
      auVar31._16_8_ = (ulong)((byte)(uVar16 >> 2) & 1) * auVar30._16_8_;
      auVar31._24_8_ = (ulong)((byte)(uVar16 >> 3) & 1) * auVar30._24_8_;
      auVar31._32_8_ = (ulong)((byte)(uVar16 >> 4) & 1) * auVar30._32_8_;
      auVar31._40_8_ = (ulong)((byte)(uVar16 >> 5) & 1) * auVar30._40_8_;
      auVar31._48_8_ = (ulong)((byte)(uVar16 >> 6) & 1) * auVar30._48_8_;
      auVar31._56_8_ = (uVar16 >> 7) * auVar30._56_8_;
      auVar30 = vpgatherqq_avx512f(*(undefined8 *)
                                    ((long)&(pmVar3->elements).
                                            super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                            ._M_impl + in_R8));
      auVar32._8_8_ = (ulong)((byte)(uVar16 >> 1) & 1) * auVar30._8_8_;
      auVar32._0_8_ = (ulong)(bVar6 & 1) * auVar30._0_8_;
      auVar32._16_8_ = (ulong)((byte)(uVar16 >> 2) & 1) * auVar30._16_8_;
      auVar32._24_8_ = (ulong)((byte)(uVar16 >> 3) & 1) * auVar30._24_8_;
      auVar32._32_8_ = (ulong)((byte)(uVar16 >> 4) & 1) * auVar30._32_8_;
      auVar32._40_8_ = (ulong)((byte)(uVar16 >> 5) & 1) * auVar30._40_8_;
      auVar32._48_8_ = (ulong)((byte)(uVar16 >> 6) & 1) * auVar30._48_8_;
      auVar32._56_8_ = (uVar16 >> 7) * auVar30._56_8_;
      auVar30 = vpsubq_avx512f(auVar31,auVar32);
      auVar30 = vpsrlq_avx512f(auVar30,3);
      auVar24 = vpmovqd_avx512f(auVar30);
      auVar24 = vpaddd_avx2(auVar33._0_32_,auVar24);
      auVar30 = ZEXT3264(auVar24);
    } while (uVar17 != 0);
    auVar24 = vmovdqa32_avx512vl(auVar24);
    auVar23._0_4_ = (uint)(bVar6 & 1) * auVar24._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar33._0_4_;
    bVar5 = (bool)((byte)(uVar16 >> 1) & 1);
    auVar23._4_4_ = (uint)bVar5 * auVar24._4_4_ | (uint)!bVar5 * auVar33._4_4_;
    bVar5 = (bool)((byte)(uVar16 >> 2) & 1);
    auVar23._8_4_ = (uint)bVar5 * auVar24._8_4_ | (uint)!bVar5 * auVar33._8_4_;
    bVar5 = (bool)((byte)(uVar16 >> 3) & 1);
    auVar23._12_4_ = (uint)bVar5 * auVar24._12_4_ | (uint)!bVar5 * auVar33._12_4_;
    bVar5 = (bool)((byte)(uVar16 >> 4) & 1);
    auVar25._16_4_ = (uint)bVar5 * auVar24._16_4_ | (uint)!bVar5 * auVar33._16_4_;
    auVar25._0_16_ = auVar23;
    bVar5 = (bool)((byte)(uVar16 >> 5) & 1);
    auVar25._20_4_ = (uint)bVar5 * auVar24._20_4_ | (uint)!bVar5 * auVar33._20_4_;
    bVar5 = (bool)((byte)(uVar16 >> 6) & 1);
    auVar25._24_4_ = (uint)bVar5 * auVar24._24_4_ | (uint)!bVar5 * auVar33._24_4_;
    bVar5 = SUB81(uVar16 >> 7,0);
    auVar25._28_4_ = (uint)bVar5 * auVar24._28_4_ | (uint)!bVar5 * auVar33._28_4_;
    auVar23 = vphaddd_avx(auVar25._16_16_,auVar23);
    auVar23 = vphaddd_avx(auVar23,auVar23);
    auVar23 = vphaddd_avx(auVar23,auVar23);
    local_50 = (ulong)auVar23._0_4_;
  }
  sVar22 = (size_type)local_50;
  uVar17 = local_50 * 8;
  _Var13._M_head_impl = (row_value *)operator_new__(uVar17);
  if (sVar22 != 0) {
    memset(_Var13._M_head_impl,0xff,uVar17);
  }
  (this->m_rows_values).m_buffer._M_t.
  super___uniq_ptr_impl<baryonyx::sparse_matrix<int>::row_value,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
  .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl =
       _Var13._M_head_impl;
  (this->m_rows_values).m_length = sVar22;
  _Var14._M_head_impl = (col_value *)operator_new__(uVar17);
  local_38 = uVar18;
  if (sVar22 != 0) {
    memset(_Var14._M_head_impl,0xff,uVar17);
  }
  (this->m_cols_values).m_buffer._M_t.
  super___uniq_ptr_impl<baryonyx::sparse_matrix<int>::col_value,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
  .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>._M_head_impl =
       _Var14._M_head_impl;
  (this->m_cols_values).m_length = sVar22;
  local_88 = (undefined1  [16])0x0;
  local_78 = (pointer)0x0;
  std::vector<access,_std::allocator<access>_>::reserve
            ((vector<access,_std::allocator<access>_> *)local_88,(long)(int)sVar22);
  local_68._M_original_len._0_4_ = 0;
  if (rows != 0) {
    do {
      pmVar3 = (csts->
               super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pfVar4 = *(pointer *)
                ((long)&pmVar3[(int)local_68._M_original_len].elements.
                        super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                        ._M_impl + 8);
      for (__args_2 = *(function_element **)
                       &pmVar3[(int)local_68._M_original_len].elements.
                        super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                        ._M_impl; __args_2 != pfVar4; __args_2 = __args_2 + 1) {
        std::
        vector<baryonyx::sparse_matrix<int>::sparse_matrix<baryonyx::itm::merged_constraint>(std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,int,int)::access,std::allocator<baryonyx::sparse_matrix<int>::sparse_matrix<baryonyx::itm::merged_constraint>(std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,int,int)::access>>
        ::emplace_back<int&,int_const&,baryonyx::function_element_const&>
                  ((vector<baryonyx::sparse_matrix<int>::sparse_matrix<baryonyx::itm::merged_constraint>(std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,int,int)::access,std::allocator<baryonyx::sparse_matrix<int>::sparse_matrix<baryonyx::itm::merged_constraint>(std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,int,int)::access>>
                    *)local_88,(int *)&local_68,&__args_2->variable_index,__args_2);
      }
      local_68._M_original_len._0_4_ = (int)local_68._M_original_len + 1;
    } while ((int)local_68._M_original_len != rows);
  }
  uVar17 = local_38;
  uVar18 = local_38 * 4;
  __s = operator_new__(uVar18);
  iVar20 = 0;
  memset(__s,0,uVar18);
  uVar8 = local_88._0_8_;
  uVar10 = *(int *)local_88._0_8_;
  if (sVar22 != 0) {
    lVar19 = 8;
    uVar18 = 0;
    iVar20 = 0;
    do {
      if (uVar10 != *(uint *)(local_88._0_8_ + lVar19 + -8)) {
        *(int *)((long)__s + (ulong)uVar10 * 4) = iVar20;
        iVar20 = 0;
        uVar10 = *(uint *)(local_88._0_8_ + lVar19 + -8);
      }
      *(int *)((long)(int *)local_88._0_8_ + lVar19) = (int)uVar18;
      iVar20 = iVar20 + 1;
      lVar7 = lVar19 + -4;
      lVar19 = lVar19 + 0x14;
      (this->m_rows_values).m_buffer._M_t.
      super___uniq_ptr_impl<baryonyx::sparse_matrix<int>::row_value,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
      ._M_t.
      super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
      .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl[uVar18]
           = (row_value)(((ulong)*(uint *)(local_88._0_8_ + lVar7) << 0x20) + uVar18);
      uVar18 = uVar18 + 1;
    } while (local_50 != uVar18);
  }
  *(int *)((long)__s + (ulong)uVar10 * 4) = iVar20;
  if (rows != 0) {
    uVar18 = 0;
    ppfVar15 = (pointer *)
               ((long)&(((csts->
                         super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                         )._M_impl.super__Vector_impl_data._M_start)->elements).
                       super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                       ._M_impl + 8);
    do {
      if (*(int *)((long)__s + uVar18 * 4) !=
          (int)((ulong)((long)*ppfVar15 - (long)((_Vector_impl_data *)(ppfVar15 + -1))->_M_start) >>
               3)) {
        sparse_matrix<baryonyx::itm::merged_constraint>();
        operator_delete(local_68._M_buffer,local_68._M_len * 0x14);
        operator_delete__(__s);
        if ((pointer)local_88._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_88._0_8_,(long)local_78 - local_88._0_8_);
        }
        _Var14._M_head_impl =
             (this->m_cols_values).m_buffer._M_t.
             super___uniq_ptr_impl<baryonyx::sparse_matrix<int>::col_value,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
             .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>._M_head_impl;
        if (_Var14._M_head_impl != (col_value *)0x0) {
          operator_delete__(_Var14._M_head_impl);
        }
        _Var13._M_head_impl =
             (this->m_rows_values).m_buffer._M_t.
             super___uniq_ptr_impl<baryonyx::sparse_matrix<int>::row_value,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
             .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl;
        (this->m_cols_values).m_buffer._M_t.
        super___uniq_ptr_impl<baryonyx::sparse_matrix<int>::col_value,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
        ._M_t.
        super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
        .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>._M_head_impl =
             (col_value *)0x0;
        if (_Var13._M_head_impl != (row_value *)0x0) {
          operator_delete__(_Var13._M_head_impl);
        }
        (this->m_rows_values).m_buffer._M_t.
        super___uniq_ptr_impl<baryonyx::sparse_matrix<int>::row_value,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
        ._M_t.
        super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
        .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl =
             (row_value *)0x0;
        _Var12._M_head_impl =
             (this->m_cols_access).m_buffer._M_t.
             super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
             super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
             super__Head_base<0UL,_int_*,_false>._M_head_impl;
        if (_Var12._M_head_impl != (int *)0x0) {
          operator_delete__(_Var12._M_head_impl);
        }
        (this->m_cols_access).m_buffer._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>.
        _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
        super__Head_base<0UL,_int_*,_false>._M_head_impl = (int *)0x0;
        _Var11.super__Head_base<0UL,_int_*,_false>._M_head_impl =
             (this->m_rows_access).m_buffer._M_t.
             super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
             super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
             super__Head_base<0UL,_int_*,_false>;
        if (_Var11.super__Head_base<0UL,_int_*,_false>._M_head_impl != (int *)0x0) {
          operator_delete__((void *)_Var11.super__Head_base<0UL,_int_*,_false>._M_head_impl);
        }
        (this->m_rows_access).m_buffer._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>.
        _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
        super__Head_base<0UL,_int_*,_false> = (_Head_base<0UL,_int_*,_false>)0x0;
        _Unwind_Resume(extraout_RAX);
      }
      uVar18 = uVar18 + 1;
      ppfVar15 = ppfVar15 + 5;
    } while (uVar17 != uVar18);
  }
  uVar9 = local_88._8_8_;
  if (local_88._0_8_ != local_88._8_8_) {
    lVar19 = ((long)(local_88._8_8_ - local_88._0_8_) >> 2) * -0x3333333333333333;
    std::
    _Temporary_buffer<__gnu_cxx::__normal_iterator<access_*,_std::vector<access,_std::allocator<access>_>_>,_access>
    ::_Temporary_buffer(&local_68,
                        (__normal_iterator<access_*,_std::vector<access,_std::allocator<access>_>_>)
                        local_88._0_8_,(lVar19 + 1) - (lVar19 + 1 >> 0x3f) >> 1);
    if (local_68._M_buffer == (pointer)0x0) {
      std::
      __inplace_stable_sort<__gnu_cxx::__normal_iterator<baryonyx::sparse_matrix<int>::sparse_matrix<baryonyx::itm::merged_constraint>(std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,int,int)::access*,std::vector<baryonyx::sparse_matrix<int>::sparse_matrix<baryonyx::itm::merged_constraint>(std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,int,int)::access,std::allocator<baryonyx::sparse_matrix<int>::sparse_matrix<baryonyx::itm::merged_constraint>(std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,int,int)::access>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::sparse_matrix<int>::sparse_matrix<baryonyx::itm::merged_constraint>(std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,int,int)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                (uVar8,uVar9);
    }
    else {
      std::
      __stable_sort_adaptive<__gnu_cxx::__normal_iterator<baryonyx::sparse_matrix<int>::sparse_matrix<baryonyx::itm::merged_constraint>(std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,int,int)::access*,std::vector<baryonyx::sparse_matrix<int>::sparse_matrix<baryonyx::itm::merged_constraint>(std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,int,int)::access,std::allocator<baryonyx::sparse_matrix<int>::sparse_matrix<baryonyx::itm::merged_constraint>(std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,int,int)::access>>>,baryonyx::sparse_matrix<int>::sparse_matrix<baryonyx::itm::merged_constraint>(std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,int,int)::access*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::sparse_matrix<int>::sparse_matrix<baryonyx::itm::merged_constraint>(std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,int,int)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                (uVar8,uVar9,local_68._M_buffer,local_68._M_len);
    }
    operator_delete(local_68._M_buffer,local_68._M_len * 0x14);
  }
  uVar18 = local_48 & 0xffffffff;
  local_40 = uVar18 * 4;
  __s_00 = operator_new__(local_40);
  iVar20 = 0;
  memset(__s_00,0,local_40);
  uVar10 = *(int *)(local_88._0_8_ + 4);
  if (sVar22 != 0) {
    lVar19 = 8;
    uVar16 = 0;
    iVar20 = 0;
    do {
      uVar2 = *(uint *)(local_88._0_8_ + lVar19 + -4);
      if (uVar10 != uVar2) {
        *(int *)((long)__s_00 + (ulong)uVar10 * 4) = iVar20;
        iVar20 = 0;
        uVar10 = uVar2;
      }
      lVar7 = lVar19 + -8;
      puVar1 = (uint *)((long)(int *)local_88._0_8_ + lVar19);
      iVar20 = iVar20 + 1;
      lVar19 = lVar19 + 0x14;
      cVar21.row = *(int *)(local_88._0_8_ + lVar7);
      cVar21.value = (this->m_rows_values).m_buffer._M_t.
                     super___uniq_ptr_impl<baryonyx::sparse_matrix<int>::row_value,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                     .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>.
                     _M_head_impl[*puVar1].value;
      (this->m_cols_values).m_buffer._M_t.
      super___uniq_ptr_impl<baryonyx::sparse_matrix<int>::col_value,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
      ._M_t.
      super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
      .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>._M_head_impl[uVar16]
           = cVar21;
      uVar16 = uVar16 + 1;
    } while (local_50 != uVar16);
  }
  *(int *)((long)__s_00 + (ulong)uVar10 * 4) = iVar20;
  _Var11.super__Head_base<0UL,_int_*,_false>._M_head_impl =
       (this->m_rows_access).m_buffer._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>.
       _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
       super__Head_base<0UL,_int_*,_false>;
  *(undefined4 *)_Var11.super__Head_base<0UL,_int_*,_false>._M_head_impl = 0;
  if (rows != 0) {
    iVar20 = 0;
    uVar16 = 0;
    do {
      iVar20 = iVar20 + *(int *)((long)__s + uVar16 * 4);
      *(int *)((long)_Var11.super__Head_base<0UL,_int_*,_false>._M_head_impl + (uVar16 + 1) * 4) =
           iVar20;
      uVar16 = uVar16 + 1;
    } while (uVar17 != uVar16);
  }
  _Var12._M_head_impl =
       (this->m_cols_access).m_buffer._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>.
       _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
       super__Head_base<0UL,_int_*,_false>._M_head_impl;
  *_Var12._M_head_impl = 0;
  if ((int)local_48 != 0) {
    iVar20 = 0;
    uVar17 = 0;
    do {
      iVar20 = iVar20 + *(int *)((long)__s_00 + uVar17 * 4);
      _Var12._M_head_impl[uVar17 + 1] = iVar20;
      uVar17 = uVar17 + 1;
    } while (uVar18 != uVar17);
  }
  operator_delete__(__s_00);
  operator_delete__(__s);
  if ((pointer)local_88._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_88._0_8_,(long)local_78 - local_88._0_8_);
  }
  return;
}

Assistant:

explicit sparse_matrix(const std::vector<Constraint>& csts,
                           const int rows,
                           const int cols)
      : m_rows_access(rows + 1)
      , m_cols_access(cols + 1)
    {
        int elem = 0;

        for (int i = 0, e = rows; i != e; ++i)
            elem += static_cast<int>(csts[i].elements.size());

        row_vector_access(elem).swap(m_rows_values);
        col_vector_access(elem).swap(m_cols_values);

        //
        // First, we build a vector of access to all elements in the matrix
        // different to 0. Then, we sort accessors according to the column id
        // then we assign a unique identifier for each accessors and then we
        // sort accessors according to the row id. This code enable the
        // construction of the r_rows_values with pointers to the
        // r_cols_values.
        //

        struct access
        {
            access() = default;

            access(int row_, int col_, function_element fct_)
              : row(row_)
              , col(col_)
              , fct(fct_)
            {}

            int row;
            int col;
            int id;
            function_element fct;
        };

        std::vector<access> accessors;
        accessors.reserve(elem);
        for (int i = 0; i != rows; ++i)
            for (const auto& fct_elem : csts[i].elements)
                accessors.emplace_back(i, fct_elem.variable_index, fct_elem);

        fixed_array<int> rinit(rows, 0);
        int row = accessors[0].row;
        int nb_row = 0;
        for (int i = 0; i != elem; ++i) {
            if (row != accessors[i].row) {
                rinit[row] = nb_row;
                nb_row = 0;
                row = accessors[i].row;
            }
            ++nb_row;

            accessors[i].id = i;
            m_rows_values[i] = { i, accessors[i].col };
        }

        rinit[row] = nb_row; /* Be sure to affect the good number of elements
                                for this constaints. */

        for (int i = 0; i != rows; ++i)
            bx_assert(rinit[i] == static_cast<int>(csts[i].elements.size()));

        // We sort the accessors to improve memory friendly access.

        std::stable_sort(
          accessors.begin(),
          accessors.end(),
          [](const auto& lhs, const auto& rhs) { return lhs.col < rhs.col; });

        fixed_array<int> cinit(cols, 0);
        int col = accessors[0].col;
        int nb_col = 0;

        for (int i = 0; i != elem; ++i) {
            if (col != accessors[i].col) {
                cinit[col] = nb_col;
                nb_col = 0;
                col = accessors[i].col;
            }
            ++nb_col;

            m_cols_values[i] = { m_rows_values[accessors[i].id].value,
                                 accessors[i].row };
        }

        cinit[col] = nb_col; /* Be sure to affect the good number of elements
                                for this constaints. */

        m_rows_access[0] = 0;
        for (int i = 0; i != rows; ++i)
            m_rows_access[i + 1] = m_rows_access[i] + rinit[i];

        m_cols_access[0] = 0;
        for (int i = 0; i != cols; ++i)
            m_cols_access[i + 1] = m_cols_access[i] + cinit[i];
    }